

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,char (*params) [7])

{
  uint uVar1;
  void *__s1;
  size_t __n;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  char *in_R8;
  ulong uVar6;
  Maybe<unsigned_long> MVar7;
  Iterator iter;
  size_t local_70;
  char (*local_68) [7];
  Iterator local_60;
  SearchKey local_48;
  StringPtr *local_40;
  size_t *local_38;
  
  local_70 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_70;
  local_48._vptr_SearchKey = (_func_char_7_ **)&PTR_search_002248f8;
  local_68 = params;
  _::BTreeImpl::search(&local_60,(BTreeImpl *)&(local_40->content).size_,&local_48);
  sVar3 = (size_t)local_60.row;
  aVar5 = extraout_RDX;
  if ((sVar3 != 0xe) && (uVar1 = (local_60.leaf)->rows[sVar3].i, uVar1 != 0)) {
    uVar6 = (ulong)(uVar1 - 1);
    lVar4 = uVar6 * 0x10;
    __s1 = *(void **)(local_70 + lVar4);
    __n = *(size_t *)(local_70 + 8 + lVar4);
    sVar3 = strlen(in_R8);
    sVar3 = sVar3 + 1;
    aVar5 = extraout_RDX_00;
    if (__n == sVar3) {
      if (__n != 0) {
        iVar2 = bcmp(__s1,in_R8,__n);
        sVar3 = CONCAT44(extraout_var,iVar2);
        aVar5 = extraout_RDX_01;
        if (iVar2 != 0) goto LAB_0015f209;
      }
      *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
      *(ulong *)(this + 8) = uVar6;
      goto LAB_0015f20c;
    }
  }
LAB_0015f209:
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
LAB_0015f20c:
  MVar7.ptr.field_1.value = aVar5.value;
  MVar7.ptr._0_8_ = sVar3;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }